

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

void __thiscall
lodepng::ExtractZlib::getTreeInflateDynamic
          (ExtractZlib *this,HuffmanTree *tree,HuffmanTree *treeD,uchar *in,size_t *bp,
          size_t inlength)

{
  byte bVar1;
  iterator iVar2;
  int iVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  unsigned_long *puVar9;
  pointer puVar10;
  ulong uVar11;
  pointer puVar12;
  size_t i_1;
  long lVar13;
  unsigned_long uVar14;
  pointer puVar15;
  pointer puVar16;
  uint uVar17;
  unsigned_long *puVar18;
  unsigned_long *puVar19;
  pointer puVar20;
  long lVar21;
  ExtractZlib *pEVar22;
  long lVar23;
  value_type_conflict2 *__val;
  long lVar24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> codelengthcode;
  int local_d4;
  ExtractZlib *local_d0;
  pointer local_c8;
  pointer local_c0;
  ulong local_b8;
  pointer local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  long local_60;
  size_t local_58;
  long local_50;
  HuffmanTree *local_48;
  HuffmanTree *local_40;
  HuffmanTree *local_38;
  
  sVar7 = *bp;
  local_d0 = this;
  local_48 = treeD;
  local_38 = tree;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x900);
  puVar4 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 0x120;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar4;
  memset(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x900);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar4;
  puVar4 = (pointer)operator_new(0x100);
  puVar15 = puVar4 + 0x20;
  local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = puVar4;
  local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar15;
  memset(puVar4,0,0x100);
  uVar11 = *bp;
  local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar15;
  if (uVar11 >> 3 < inlength - 2) {
    lVar8 = 0;
    uVar6 = uVar11;
    lVar13 = 0;
    do {
      local_50 = lVar13;
      uVar5 = uVar6;
      uVar6 = uVar5 + 1;
      lVar23 = (ulong)((in[uVar5 >> 3] >> ((uint)uVar5 & 7) & 1) != 0) << ((byte)lVar8 & 0x3f);
      *bp = uVar6;
      lVar13 = local_50 + lVar23;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    lVar8 = 0;
    local_c0 = (pointer)0x0;
    do {
      bVar1 = in[uVar6 + lVar8 >> 3];
      *bp = uVar6 + lVar8 + 1;
      local_c0 = (pointer)((long)local_c0 +
                          ((ulong)((bVar1 >> ((int)uVar11 + 5 + (int)lVar8 & 7U) & 1) != 0) <<
                          ((byte)lVar8 & 0x3f)));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    lVar8 = 0;
    lVar21 = 0;
    uVar11 = uVar5 + 6;
    do {
      bVar1 = in[uVar11 >> 3];
      uVar17 = (uint)uVar11;
      uVar11 = uVar11 + 1;
      *bp = uVar5 + 6 + lVar8 + 1;
      lVar21 = lVar21 + ((ulong)((bVar1 >> (uVar17 & 7) & 1) != 0) << ((byte)lVar8 & 0x3f));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = *(long *)(local_d0->zlibinfo + 8);
    *(int *)(lVar8 + -0x110) = (int)lVar13;
    *(int *)(lVar8 + -0x10c) = (int)local_c0;
    *(int *)(lVar8 + -0x108) = (int)lVar21;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8 = inlength;
    local_58 = sVar7;
    puVar4 = (pointer)operator_new(0x98);
    local_b0 = (pointer)(lVar13 + 0x101);
    local_c8 = puVar4 + 0x13;
    uVar11 = 0;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_c8;
    local_60 = lVar13;
    memset(puVar4,0,0x98);
    pEVar22 = local_d0;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = local_c8;
    sVar7 = *bp;
    do {
      if (uVar11 < lVar21 + 4U) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          bVar1 = in[sVar7 + lVar13 >> 3];
          *bp = sVar7 + lVar13 + 1;
          uVar14 = uVar14 + ((ulong)((bVar1 >> ((uint)(sVar7 + lVar13) & 7) & 1) != 0) <<
                            ((byte)lVar13 & 0x3f));
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        sVar7 = sVar7 + 3;
      }
      else {
        uVar14 = 0;
      }
      puVar4[(&CLCL)[uVar11]] = uVar14;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x13);
    uVar11 = 0;
    puVar15 = local_c8;
    do {
      lVar13 = *(long *)(pEVar22->zlibinfo + 8);
      local_d4 = (int)puVar4[uVar11];
      iVar2._M_current = *(int **)(lVar13 + -0xf8);
      if (iVar2._M_current == *(int **)(lVar13 + -0xf0)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(lVar13 + -0x100),iVar2,&local_d4);
        puVar15 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish;
        puVar4 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *iVar2._M_current = local_d4;
        *(int **)(lVar13 + -0xf8) = iVar2._M_current + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)puVar15 - (long)puVar4 >> 3));
    local_40 = &pEVar22->codelengthcodetree;
    iVar3 = HuffmanTree::makeFromLengths(local_40,&local_78,7);
    pEVar22->error = iVar3;
    if (iVar3 == 0) {
      puVar4 = (pointer)((long)local_c0 + local_60 + 0x102);
      if (puVar4 != (pointer)0x0) {
        lVar23 = lVar23 + local_50;
        local_c8 = (pointer)0x0;
        uVar11 = local_b8;
        local_c0 = puVar4;
        do {
          uVar14 = huffmanDecodeSymbol(pEVar22,in,bp,local_40,uVar11);
          if (pEVar22->error != 0) goto LAB_001209fb;
          lVar13 = *(long *)(pEVar22->zlibinfo + 8);
          local_d4 = (int)uVar14;
          iVar2._M_current = *(int **)(lVar13 + -0xe0);
          if (iVar2._M_current == *(int **)(lVar13 + -0xd8)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)(lVar13 + -0xe8),iVar2,&local_d4);
            puVar4 = local_c0;
          }
          else {
            *iVar2._M_current = local_d4;
            *(int **)(lVar13 + -0xe0) = iVar2._M_current + 1;
          }
          if (uVar14 < 0x10) {
            puVar9 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)local_c8;
            if (local_b0 <= local_c8) {
              puVar9 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + ((long)local_c8 - (long)local_b0);
            }
            *puVar9 = uVar14;
            puVar15 = (pointer)((long)local_c8 + 1);
          }
          else {
            pEVar22 = local_d0;
            if (uVar14 == 0x12) {
              uVar6 = *bp;
              if (uVar11 <= uVar6 >> 3) {
LAB_001209de:
                iVar3 = 0x32;
                goto LAB_001209f6;
              }
              lVar8 = 0;
              lVar13 = 0;
              do {
                lVar21 = lVar13;
                lVar24 = (ulong)((in[uVar6 + lVar8 >> 3] >> ((uint)(uVar6 + lVar8) & 7) & 1) != 0)
                         << ((byte)lVar8 & 0x3f);
                *bp = uVar6 + 1 + lVar8;
                lVar13 = lVar21 + lVar24;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 7);
              lVar13 = lVar13 + 0xb;
              lVar8 = *(long *)(local_d0->zlibinfo + 8);
              local_d4 = (int)lVar13;
              iVar2._M_current = *(int **)(lVar8 + -0xe0);
              if (iVar2._M_current == *(int **)(lVar8 + -0xd8)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)(lVar8 + -0xe8),iVar2,&local_d4);
              }
              else {
                *iVar2._M_current = local_d4;
                *(int **)(lVar8 + -0xe0) = iVar2._M_current + 1;
              }
              uVar11 = local_b8;
              puVar15 = local_c8;
              pEVar22 = local_d0;
              puVar4 = local_c0;
              if (lVar13 != 0) {
                puVar15 = (pointer)((long)local_c8 + lVar24 + lVar21 + 0xb);
                puVar12 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          (long)local_c8 + (-0x101 - lVar23);
                puVar10 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_c8;
                puVar20 = local_c8;
                do {
                  if (local_c0 <= puVar20) {
                    iVar3 = 0xf;
                    goto LAB_001209f6;
                  }
                  puVar16 = puVar12;
                  if (puVar20 < local_b0) {
                    puVar16 = puVar10;
                  }
                  *puVar16 = 0;
                  puVar20 = (pointer)((long)puVar20 + 1);
                  puVar12 = puVar12 + 1;
                  puVar10 = puVar10 + 1;
                  lVar13 = lVar13 + -1;
                } while (lVar13 != 0);
              }
            }
            else if (uVar14 == 0x11) {
              uVar6 = *bp;
              if (uVar11 <= uVar6 >> 3) goto LAB_001209de;
              lVar8 = 0;
              lVar13 = 0;
              do {
                lVar21 = lVar13;
                lVar24 = (ulong)((in[uVar6 + lVar8 >> 3] >> ((uint)(uVar6 + lVar8) & 7) & 1) != 0)
                         << ((byte)lVar8 & 0x3f);
                *bp = uVar6 + 1 + lVar8;
                lVar13 = lVar21 + lVar24;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar13 = lVar13 + 3;
              lVar8 = *(long *)(local_d0->zlibinfo + 8);
              local_d4 = (int)lVar13;
              iVar2._M_current = *(int **)(lVar8 + -0xe0);
              if (iVar2._M_current == *(int **)(lVar8 + -0xd8)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)(lVar8 + -0xe8),iVar2,&local_d4);
              }
              else {
                *iVar2._M_current = local_d4;
                *(int **)(lVar8 + -0xe0) = iVar2._M_current + 1;
              }
              uVar11 = local_b8;
              puVar15 = local_c8;
              pEVar22 = local_d0;
              puVar4 = local_c0;
              if (lVar13 != 0) {
                puVar15 = (pointer)((long)local_c8 + lVar24 + lVar21 + 3);
                puVar12 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          (long)local_c8 + (-0x101 - lVar23);
                puVar10 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_c8;
                puVar20 = local_c8;
                do {
                  if (local_c0 <= puVar20) {
                    iVar3 = 0xe;
                    goto LAB_001209f6;
                  }
                  puVar16 = puVar12;
                  if (puVar20 < local_b0) {
                    puVar16 = puVar10;
                  }
                  *puVar16 = 0;
                  puVar20 = (pointer)((long)puVar20 + 1);
                  puVar12 = puVar12 + 1;
                  puVar10 = puVar10 + 1;
                  lVar13 = lVar13 + -1;
                } while (lVar13 != 0);
              }
            }
            else {
              if (uVar14 != 0x10) {
                iVar3 = 0x10;
                goto LAB_001209f6;
              }
              uVar6 = *bp;
              if (uVar11 <= uVar6 >> 3) {
                iVar3 = 0x32;
                goto LAB_001209f6;
              }
              lVar8 = 0;
              lVar13 = 0;
              do {
                lVar24 = lVar13;
                lVar21 = (ulong)((in[uVar6 + lVar8 >> 3] >> ((uint)(uVar6 + lVar8) & 7) & 1) != 0)
                         << ((byte)lVar8 & 0x3f);
                *bp = uVar6 + 1 + lVar8;
                lVar8 = lVar8 + 1;
                lVar13 = lVar21 + lVar24;
              } while (lVar8 != 2);
              puVar20 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        (long)local_c8 + (-0x102 - local_60);
              if ((pointer)((long)local_c8 - 1U) < local_b0) {
                puVar20 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start + ((long)local_c8 - 1);
              }
              puVar15 = local_c8;
              if (lVar21 + lVar24 != -3) {
                uVar14 = *puVar20;
                puVar15 = (pointer)((long)local_c8 + lVar21 + lVar24 + 3);
                puVar18 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          (long)local_c8 + (-0x101 - lVar23);
                lVar13 = lVar24 + lVar21 + 3;
                puVar9 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + (long)local_c8;
                puVar20 = local_c8;
                do {
                  if (puVar4 <= puVar20) {
                    iVar3 = 0xd;
                    goto LAB_001209f6;
                  }
                  puVar19 = puVar18;
                  if (puVar20 < local_b0) {
                    puVar19 = puVar9;
                  }
                  *puVar19 = uVar14;
                  puVar20 = (pointer)((long)puVar20 + 1);
                  puVar18 = puVar18 + 1;
                  puVar9 = puVar9 + 1;
                  lVar13 = lVar13 + -1;
                } while (lVar13 != 0);
              }
            }
          }
          local_c8 = puVar15;
        } while (puVar15 < puVar4);
      }
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[0x100] == 0) {
        iVar3 = 0x40;
LAB_001209f6:
        pEVar22->error = iVar3;
      }
      else {
        iVar3 = HuffmanTree::makeFromLengths(local_38,&local_a8,0xf);
        pEVar22->error = iVar3;
        if (iVar3 == 0) {
          iVar3 = HuffmanTree::makeFromLengths(local_48,&local_90,0xf);
          pEVar22->error = iVar3;
          if (iVar3 == 0) {
            *(size_t *)(*(long *)(pEVar22->zlibinfo + 8) + -0x118) = *bp - local_58;
            if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar11 = 0;
              puVar4 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              do {
                lVar13 = *(long *)(pEVar22->zlibinfo + 8);
                local_d4 = (int)local_a8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar11];
                iVar2._M_current = *(int **)(lVar13 + -200);
                if (iVar2._M_current == *(int **)(lVar13 + -0xc0)) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)(lVar13 + -0xd0),iVar2,&local_d4);
                  puVar4 = local_a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                }
                else {
                  *iVar2._M_current = local_d4;
                  *(int **)(lVar13 + -200) = iVar2._M_current + 1;
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 < (ulong)((long)puVar4 -
                                        (long)local_a8.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3));
            }
            if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar11 = 0;
              puVar4 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              do {
                lVar13 = *(long *)(pEVar22->zlibinfo + 8);
                local_d4 = (int)local_90.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar11];
                iVar2._M_current = *(int **)(lVar13 + -0xb0);
                if (iVar2._M_current == *(int **)(lVar13 + -0xa8)) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)(lVar13 + -0xb8),iVar2,&local_d4);
                  puVar4 = local_90.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                }
                else {
                  *iVar2._M_current = local_d4;
                  *(int **)(lVar13 + -0xb0) = iVar2._M_current + 1;
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 < (ulong)((long)puVar4 -
                                        (long)local_90.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 3));
            }
          }
        }
      }
    }
LAB_001209fb:
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    puVar4 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00120a2c;
  }
  else {
    local_d0->error = 0x31;
  }
  operator_delete(puVar4,(long)local_90.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
LAB_00120a2c:
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void getTreeInflateDynamic(HuffmanTree& tree, HuffmanTree& treeD,
                             const unsigned char* in, size_t& bp, size_t inlength) {
    size_t bpstart = bp;
    //get the tree of a deflated block with dynamic tree, the tree itself is also Huffman compressed with a known tree
    std::vector<unsigned long> bitlen(288, 0), bitlenD(32, 0);
    if(bp >> 3 >= inlength - 2) { error = 49; return; } //the bit pointer is or will go past the memory
    size_t HLIT =  readBitsFromStream(bp, in, 5) + 257; //number of literal/length codes + 257
    size_t HDIST = readBitsFromStream(bp, in, 5) + 1; //number of dist codes + 1
    size_t HCLEN = readBitsFromStream(bp, in, 4) + 4; //number of code length codes + 4
    zlibinfo->back().hlit = HLIT - 257;
    zlibinfo->back().hdist = HDIST - 1;
    zlibinfo->back().hclen = HCLEN - 4;
    std::vector<unsigned long> codelengthcode(19); //lengths of tree to decode the lengths of the dynamic tree
    for(size_t i = 0; i < 19; i++) codelengthcode[CLCL[i]] = (i < HCLEN) ? readBitsFromStream(bp, in, 3) : 0;
    //code length code lengths
    for(size_t i = 0; i < codelengthcode.size(); i++) zlibinfo->back().clcl.push_back(codelengthcode[i]);
    error = codelengthcodetree.makeFromLengths(codelengthcode, 7); if(error) return;
    size_t i = 0, replength;
    while(i < HLIT + HDIST) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codelengthcodetree, inlength); if(error) return;
      zlibinfo->back().treecodes.push_back(code); //tree symbol code
      if(code <= 15)  { if(i < HLIT) bitlen[i++] = code; else bitlenD[i++ - HLIT] = code; } //a length code
      else if(code == 16) { //repeat previous
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 2);
        unsigned long value; //set value to the previous code
        if((i - 1) < HLIT) value = bitlen[i - 1];
        else value = bitlenD[i - HLIT - 1];
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 13; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = value; else bitlenD[i++ - HLIT] = value;
        }
      } else if(code == 17) { //repeat "0" 3-10 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 3);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 14; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      } else if(code == 18) { //repeat "0" 11-138 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 11 + readBitsFromStream(bp, in, 7);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 15; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      }
      else { error = 16; return; } //error: somehow an unexisting code appeared. This can never happen.
    }
    if(bitlen[256] == 0) { error = 64; return; } //the length of the end code 256 must be larger than 0
    error = tree.makeFromLengths(bitlen, 15);
    if(error) return; //now we've finally got HLIT and HDIST, so generate the code trees, and the function is done
    error = treeD.makeFromLengths(bitlenD, 15);
    if(error) return;
    zlibinfo->back().treebits = bp - bpstart;
    //lit/len/end symbol lengths
    for(size_t j = 0; j < bitlen.size(); j++) zlibinfo->back().litlenlengths.push_back(bitlen[j]);
    //dist lengths
    for(size_t j = 0; j < bitlenD.size(); j++) zlibinfo->back().distlengths.push_back(bitlenD[j]);
  }